

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.hpp
# Opt level: O3

void __thiscall limonp::Logger::Logger(Logger *this,size_t level,char *filename,int lineno)

{
  char *__s;
  tm *__tp;
  size_t sVar1;
  ostream *poVar2;
  time_t now;
  char buf [32];
  time_t local_50;
  char local_48 [40];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  this->level_ = level;
  if (level < 6) {
    time(&local_50);
    __tp = localtime(&local_50);
    strftime(local_48,0x20,"%Y-%m-%d %H:%M:%S",__tp);
    sVar1 = strlen(local_48);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,local_48,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
    if (filename == (char *)0x0) {
      std::ios::clear((int)this + (int)*(undefined8 *)(*(long *)this + -0x18));
    }
    else {
      sVar1 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,filename,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)this,lineno);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    __s = *(char **)(LOG_LEVEL_ARRAY + this->level_ * 8);
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    return;
  }
  __assert_fail("level_ <= sizeof(LOG_LEVEL_ARRAY)/sizeof(*LOG_LEVEL_ARRAY)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/deps/limonp/Logging.hpp"
                ,0x2a,"limonp::Logger::Logger(size_t, const char *, int)");
}

Assistant:

Logger(size_t level, const char* filename, int lineno)
   : level_(level) {
#ifdef LOGGING_LEVEL
     if (level_ < LOGGING_LEVEL) {
       return;
     }
#endif
    assert(level_ <= sizeof(LOG_LEVEL_ARRAY)/sizeof(*LOG_LEVEL_ARRAY));
    char buf[32];
    time_t now;
    time(&now);
    strftime(buf, sizeof(buf), LOG_TIME_FORMAT, localtime(&now));
    stream_ << buf 
      << " " << filename 
      << ":" << lineno 
      << " " << LOG_LEVEL_ARRAY[level_] 
      << " ";
  }